

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::int_writer<long_long,_fmt::v5::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  ulong uVar1;
  long lVar2;
  num_writer f;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  string_view prefix;
  undefined4 uStack_24;
  
  uVar1 = this->abs_value;
  uVar4 = uVar1 | 1;
  lVar2 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar5 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  cVar3 = internal::thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
  iVar6 = uVar5 - (uVar1 < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)[uVar5]);
  uVar5 = iVar6 * 0x56;
  iVar6 = iVar6 + (uint)(byte)((char)((uVar5 & 0xffff) >> 0xf) + (char)(uVar5 >> 8)) + 1;
  uStack_24 = CONCAT31(uStack_24._1_3_,cVar3);
  f._12_4_ = uStack_24;
  f.size = iVar6;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
              *)this->writer,iVar6,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }